

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O3

void mergesort_4way(uchar **strings,size_t n,uchar **tmp)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  uchar **ppuVar4;
  uchar **ppuVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  ulong n_00;
  ulong uVar9;
  size_t n_01;
  
  if (0x1f < n) {
    n_00 = n >> 2;
    uVar9 = n >> 1;
    mergesort_4way(strings,n_00,tmp);
    mergesort_4way(strings + n_00,uVar9 - n_00,tmp);
    mergesort_4way(strings + uVar9,n_00,tmp);
    n_01 = n - (n_00 + uVar9);
    mergesort_4way(strings + n_00 + uVar9,n_01,tmp);
    merge_4way(strings,n_00,strings + n_00,uVar9 - n_00,strings + uVar9,n_00,strings + n_00 + uVar9,
               n_01,tmp);
    memcpy(strings,tmp,n << 3);
    return;
  }
  ppuVar4 = strings;
  if (1 < n) {
    do {
      pbVar1 = ppuVar4[1];
      for (ppuVar5 = ppuVar4 + 1; strings < ppuVar5; ppuVar5 = ppuVar5 + -1) {
        pbVar2 = ppuVar5[-1];
        bVar6 = *pbVar2;
        bVar7 = *pbVar1;
        if (bVar6 != 0 && bVar6 == bVar7) {
          lVar8 = 1;
          do {
            bVar6 = pbVar2[lVar8];
            bVar7 = pbVar1[lVar8];
            if (bVar6 == 0) break;
            lVar8 = lVar8 + 1;
          } while (bVar6 == bVar7);
        }
        if (bVar6 <= bVar7) break;
        *ppuVar5 = pbVar2;
      }
      iVar3 = (int)n;
      *ppuVar5 = pbVar1;
      n = (size_t)(iVar3 - 1);
      ppuVar4 = ppuVar4 + 1;
    } while (2 < iVar3);
  }
  return;
}

Assistant:

void
mergesort_4way(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = split0+split1;
	mergesort_4way(strings,        split0,        tmp);
	mergesort_4way(strings+split0, split1-split0, tmp);
	mergesort_4way(strings+split1, split2-split1, tmp);
	mergesort_4way(strings+split2, n-split2,      tmp);
	merge_4way(strings,        split0,
	           strings+split0, split1-split0,
	           strings+split1, split2-split1,
	           strings+split2, n-split2,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}